

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O1

GLenum Diligent::TypeToGLTexFormat(VALUE_TYPE ValType,Uint32 NumComponents,Bool bIsNormalized)

{
  ulong uVar1;
  undefined *puVar2;
  undefined7 in_register_00000039;
  string msg;
  string local_30;
  
  switch((int)CONCAT71(in_register_00000039,ValType)) {
  case 1:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        return 0x8f94;
      }
      if (NumComponents == 4) {
        return 0x8f97;
      }
      if (NumComponents == 2) {
        return 0x8f95;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x22a);
    }
    else {
      if (NumComponents == 1) {
        return 0x8231;
      }
      if (NumComponents == 4) {
        return 0x8d8e;
      }
      if (NumComponents == 2) {
        return 0x8237;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x234);
    }
    break;
  case 2:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        return 0x8f98;
      }
      if (NumComponents == 4) {
        return 0x8f9b;
      }
      if (NumComponents == 2) {
        return 0x8f99;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1fa);
    }
    else {
      if (NumComponents == 1) {
        return 0x8233;
      }
      if (NumComponents == 4) {
        return 0x8d88;
      }
      if (NumComponents == 2) {
        return 0x8239;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x204);
    }
    break;
  case 3:
    if (bIsNormalized) {
      FormatString<char[62]>
                (&local_30,
                 (char (*) [62])"32-bit UNORM formats are not supported. Use R32_FLOAT instead");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1d9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    if (NumComponents - 1 < 4) {
      uVar1 = (ulong)(NumComponents - 1);
      puVar2 = &DAT_00333520;
LAB_0016e44b:
      return *(GLenum *)(puVar2 + uVar1 * 4);
    }
    FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x1e0);
    break;
  case 4:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        return 0x8229;
      }
      if (NumComponents == 4) {
        return 0x8058;
      }
      if (NumComponents == 2) {
        return 0x822b;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x242);
    }
    else {
      if (NumComponents == 1) {
        return 0x8232;
      }
      if (NumComponents == 4) {
        return 0x8d7c;
      }
      if (NumComponents == 2) {
        return 0x8238;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x24c);
    }
    break;
  case 5:
    if (bIsNormalized) {
      if (NumComponents == 1) {
        return 0x822a;
      }
      if (NumComponents == 4) {
        return 0x805b;
      }
      if (NumComponents == 2) {
        return 0x822c;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x212);
    }
    else {
      if (NumComponents == 1) {
        return 0x8234;
      }
      if (NumComponents == 4) {
        return 0x8d76;
      }
      if (NumComponents == 2) {
        return 0x823a;
      }
      FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x21c);
    }
    break;
  case 6:
    if (bIsNormalized) {
      FormatString<char[62]>
                (&local_30,
                 (char (*) [62])"32-bit UNORM formats are not supported. Use R32_FLOAT instead");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1e6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    if (NumComponents - 1 < 4) {
      uVar1 = (ulong)(NumComponents - 1);
      puVar2 = &DAT_00333530;
      goto LAB_0016e44b;
    }
    FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x1ed);
    break;
  case 7:
    if (bIsNormalized) {
      FormatString<char[44]>(&local_30,(char (*) [44])"Floating point formats cannot be normalized")
      ;
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    if (NumComponents == 1) {
      return 0x822d;
    }
    if (NumComponents == 4) {
      return 0x881a;
    }
    if (NumComponents == 2) {
      return 0x822f;
    }
    FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x1c6);
    break;
  case 8:
    if (bIsNormalized) {
      FormatString<char[44]>(&local_30,(char (*) [44])"Floating point formats cannot be normalized")
      ;
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
                 ,0x1cc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    if (NumComponents - 1 < 4) {
      uVar1 = (ulong)(NumComponents - 1);
      puVar2 = &DAT_00333510;
      goto LAB_0016e44b;
    }
    FormatString<char[33]>(&local_30,(char (*) [33])"Unsupported number of components");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x1d3);
    break;
  default:
    FormatString<char[19]>(&local_30,(char (*) [19])"Unsupported format");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"TypeToGLTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0x251);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

GLenum TypeToGLTexFormat(VALUE_TYPE ValType, Uint32 NumComponents, Bool bIsNormalized)
{
    switch (ValType)
    {
        case VT_FLOAT16:
        {
            VERIFY(!bIsNormalized, "Floating point formats cannot be normalized");
            switch (NumComponents)
            {
                case 1: return GL_R16F;
                case 2: return GL_RG16F;
                case 4: return GL_RGBA16F;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_FLOAT32:
        {
            VERIFY(!bIsNormalized, "Floating point formats cannot be normalized");
            switch (NumComponents)
            {
                case 1: return GL_R32F;
                case 2: return GL_RG32F;
                case 3: return GL_RGB32F;
                case 4: return GL_RGBA32F;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_INT32:
        {
            VERIFY(!bIsNormalized, "32-bit UNORM formats are not supported. Use R32_FLOAT instead");
            switch (NumComponents)
            {
                case 1: return GL_R32I;
                case 2: return GL_RG32I;
                case 3: return GL_RGB32I;
                case 4: return GL_RGBA32I;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_UINT32:
        {
            VERIFY(!bIsNormalized, "32-bit UNORM formats are not supported. Use R32_FLOAT instead");
            switch (NumComponents)
            {
                case 1: return GL_R32UI;
                case 2: return GL_RG32UI;
                case 3: return GL_RGB32UI;
                case 4: return GL_RGBA32UI;
                default: UNEXPECTED("Unsupported number of components"); return 0;
            }
        }

        case VT_INT16:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16_SNORM;
                    case 2: return GL_RG16_SNORM;
                    case 4: return GL_RGBA16_SNORM;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16I;
                    case 2: return GL_RG16I;
                    case 4: return GL_RGBA16I;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        case VT_UINT16:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16;
                    case 2: return GL_RG16;
                    case 4: return GL_RGBA16;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R16UI;
                    case 2: return GL_RG16UI;
                    case 4: return GL_RGBA16UI;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        case VT_INT8:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8_SNORM;
                    case 2: return GL_RG8_SNORM;
                    case 4: return GL_RGBA8_SNORM;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8I;
                    case 2: return GL_RG8I;
                    case 4: return GL_RGBA8I;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        case VT_UINT8:
        {
            if (bIsNormalized)
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8;
                    case 2: return GL_RG8;
                    case 4: return GL_RGBA8;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
            else
            {
                switch (NumComponents)
                {
                    case 1: return GL_R8UI;
                    case 2: return GL_RG8UI;
                    case 4: return GL_RGBA8UI;
                    default: UNEXPECTED("Unsupported number of components"); return 0;
                }
            }
        }

        default: UNEXPECTED("Unsupported format"); return 0;
    }
}